

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_util.cc
# Opt level: O0

bool __thiscall upb::fuzz::anon_unknown_0::Builder::LinkMessages(Builder *this)

{
  upb_MiniTable *table_00;
  size_type sVar1;
  bool bVar2;
  _Bool _Var3;
  upb_CType uVar4;
  reference ppuVar5;
  size_type sVar6;
  upb_MiniTable *sub;
  upb_MiniTableEnum *sub_00;
  upb_MiniTableField *f;
  upb_MiniTableEnum *et;
  upb_MiniTableField *field;
  size_t i;
  upb_MiniTable *table;
  upb_MiniTable *t;
  iterator __end2;
  iterator __begin2;
  vector<const_upb_MiniTable_*,_std::allocator<const_upb_MiniTable_*>_> *__range2;
  Builder *this_local;
  
  __end2 = std::vector<const_upb_MiniTable_*,_std::allocator<const_upb_MiniTable_*>_>::begin
                     (&this->mini_tables_);
  t = (upb_MiniTable *)
      std::vector<const_upb_MiniTable_*,_std::allocator<const_upb_MiniTable_*>_>::end
                (&this->mini_tables_);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_upb_MiniTable_**,_std::vector<const_upb_MiniTable_*,_std::allocator<const_upb_MiniTable_*>_>_>
                                *)&t);
    if (!bVar2) {
      return true;
    }
    ppuVar5 = __gnu_cxx::
              __normal_iterator<const_upb_MiniTable_**,_std::vector<const_upb_MiniTable_*,_std::allocator<const_upb_MiniTable_*>_>_>
              ::operator*(&__end2);
    table_00 = *ppuVar5;
    for (field = (upb_MiniTableField *)0x0;
        field < (upb_MiniTableField *)
                (ulong)table_00->field_count_dont_copy_me__upb_internal_use_only;
        field = (upb_MiniTableField *)((long)&field->number_dont_copy_me__upb_internal_use_only + 1)
        ) {
      f = table_00->fields_dont_copy_me__upb_internal_use_only + (long)field;
      sVar1 = this->link_;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->input_->links);
      if (sVar1 == sVar6) {
        this->link_ = 0;
      }
      uVar4 = upb_MiniTableField_CType(f);
      if (uVar4 == kUpb_CType_Message) {
        sub = NextMiniTable(this);
        _Var3 = upb_MiniTable_SetSubMessage(table_00,f,sub);
        if (!_Var3) {
          return false;
        }
      }
      bVar2 = upb_MiniTableField_IsClosedEnum(f);
      if (bVar2) {
        sub_00 = NextEnumTable(this);
        if (sub_00 == (upb_MiniTableEnum *)0x0) {
          f->descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
        }
        else {
          _Var3 = upb_MiniTable_SetSubEnum(table_00,f,sub_00);
          if (!_Var3) {
            return false;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_upb_MiniTable_**,_std::vector<const_upb_MiniTable_*,_std::allocator<const_upb_MiniTable_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool Builder::LinkMessages() {
  for (auto* t : mini_tables_) {
    upb_MiniTable* table = const_cast<upb_MiniTable*>(t);
    // For each field that requires a sub-table, assign one as appropriate.
    for (size_t i = 0; i < table->UPB_PRIVATE(field_count); i++) {
      upb_MiniTableField* field =
          const_cast<upb_MiniTableField*>(&table->UPB_PRIVATE(fields)[i]);
      if (link_ == input_->links.size()) link_ = 0;
      if (upb_MiniTableField_CType(field) == kUpb_CType_Message &&
          !upb_MiniTable_SetSubMessage(table, field, NextMiniTable())) {
        return false;
      }
      if (upb_MiniTableField_IsClosedEnum(field)) {
        auto* et = NextEnumTable();
        if (et) {
          if (!upb_MiniTable_SetSubEnum(table, field, et)) return false;
        } else {
          // We don't have any sub-enums.  Override the field type so that it is
          // not needed.
          field->UPB_PRIVATE(descriptortype) = kUpb_FieldType_Int32;
        }
      }
    }
  }
  return true;
}